

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FixedBlockMemoryAllocator.cpp
# Opt level: O0

void __thiscall Diligent::FixedBlockMemoryAllocator::Free(FixedBlockMemoryAllocator *this,void *Ptr)

{
  char (*pacVar1) [27];
  bool bVar2;
  pointer ppVar3;
  char (*Args_1) [27];
  reference pvVar4;
  size_type sVar5;
  Char *pCVar6;
  undefined1 local_a8 [8];
  string msg_1;
  undefined1 local_68 [8];
  string msg;
  unsigned_long PageId;
  _Node_iterator_base<std::pair<void_*const,_unsigned_long>,_false> local_28;
  iterator PageIdIt;
  lock_guard<std::mutex> LockGuard;
  void *Ptr_local;
  FixedBlockMemoryAllocator *this_local;
  
  LockGuard._M_device = (mutex_type *)Ptr;
  std::lock_guard<std::mutex>::lock_guard((lock_guard<std::mutex> *)&PageIdIt,&this->m_Mutex);
  local_28._M_cur =
       (__node_type *)
       std::
       unordered_map<void_*,_unsigned_long,_std::hash<void_*>,_std::equal_to<void_*>,_Diligent::STDAllocator<std::pair<void_*const,_unsigned_long>,_Diligent::IMemoryAllocator>_>
       ::find(&this->m_AddrToPageId,&LockGuard._M_device);
  PageId = (unsigned_long)
           std::
           unordered_map<void_*,_unsigned_long,_std::hash<void_*>,_std::equal_to<void_*>,_Diligent::STDAllocator<std::pair<void_*const,_unsigned_long>,_Diligent::IMemoryAllocator>_>
           ::end(&this->m_AddrToPageId);
  bVar2 = std::__detail::operator!=
                    (&local_28,
                     (_Node_iterator_base<std::pair<void_*const,_unsigned_long>,_false> *)&PageId);
  if (bVar2) {
    ppVar3 = std::__detail::_Node_iterator<std::pair<void_*const,_unsigned_long>,_false,_false>::
             operator->((_Node_iterator<std::pair<void_*const,_unsigned_long>,_false,_false> *)
                        &local_28);
    pacVar1 = (char (*) [27])ppVar3->second;
    msg.field_2._8_8_ = pacVar1;
    Args_1 = (char (*) [27])
             std::
             vector<Diligent::FixedBlockMemoryAllocator::MemoryPage,_Diligent::STDAllocator<Diligent::FixedBlockMemoryAllocator::MemoryPage,_Diligent::IMemoryAllocator>_>
             ::size(&this->m_PagePool);
    if (Args_1 <= pacVar1) {
      FormatString<char[26],char[27]>
                ((string *)local_68,(Diligent *)"Debug expression failed:\n",
                 (char (*) [26])"PageId < m_PagePool.size()",Args_1);
      pCVar6 = (Char *)std::__cxx11::string::c_str();
      DebugAssertionFailed
                (pCVar6,"Free",
                 "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Common/src/FixedBlockMemoryAllocator.cpp"
                 ,0xf3);
      std::__cxx11::string::~string((string *)local_68);
    }
    pvVar4 = std::
             vector<Diligent::FixedBlockMemoryAllocator::MemoryPage,_Diligent::STDAllocator<Diligent::FixedBlockMemoryAllocator::MemoryPage,_Diligent::IMemoryAllocator>_>
             ::operator[](&this->m_PagePool,msg.field_2._8_8_);
    MemoryPage::DeAllocate(pvVar4,LockGuard._M_device);
    std::
    unordered_set<unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_Diligent::STDAllocator<unsigned_long,_Diligent::IMemoryAllocator>_>
    ::insert(&this->m_AvailablePages,(value_type *)(msg.field_2._M_local_buf + 8));
    msg_1.field_2._8_8_ =
         std::
         unordered_map<void_*,_unsigned_long,_std::hash<void_*>,_std::equal_to<void_*>,_Diligent::STDAllocator<std::pair<void_*const,_unsigned_long>,_Diligent::IMemoryAllocator>_>
         ::erase(&this->m_AddrToPageId,(iterator)local_28._M_cur);
    sVar5 = std::
            unordered_set<unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_Diligent::STDAllocator<unsigned_long,_Diligent::IMemoryAllocator>_>
            ::size(&this->m_AvailablePages);
    if (1 < sVar5) {
      pvVar4 = std::
               vector<Diligent::FixedBlockMemoryAllocator::MemoryPage,_Diligent::STDAllocator<Diligent::FixedBlockMemoryAllocator::MemoryPage,_Diligent::IMemoryAllocator>_>
               ::operator[](&this->m_PagePool,msg.field_2._8_8_);
      MemoryPage::HasAllocations(pvVar4);
    }
  }
  else {
    FormatString<char[67]>
              ((string *)local_a8,
               (char (*) [67])"Address not found in the allocations list - double freeing memory?");
    pCVar6 = (Char *)std::__cxx11::string::c_str();
    DebugAssertionFailed
              (pCVar6,"Free",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Common/src/FixedBlockMemoryAllocator.cpp"
               ,0x102);
    std::__cxx11::string::~string((string *)local_a8);
  }
  std::lock_guard<std::mutex>::~lock_guard((lock_guard<std::mutex> *)&PageIdIt);
  return;
}

Assistant:

void FixedBlockMemoryAllocator::Free(void* Ptr)
{
    std::lock_guard<std::mutex> LockGuard(m_Mutex);
    auto                        PageIdIt = m_AddrToPageId.find(Ptr);
    if (PageIdIt != m_AddrToPageId.end())
    {
        auto PageId = PageIdIt->second;
        VERIFY_EXPR(PageId < m_PagePool.size());
        m_PagePool[PageId].DeAllocate(Ptr);
        m_AvailablePages.insert(PageId);
        m_AddrToPageId.erase(PageIdIt);
        if (m_AvailablePages.size() > 1 && !m_PagePool[PageId].HasAllocations())
        {
            // In current implementation pages are never released!
            // Note that if we delete a page, all indices past it will be invalid

            //m_PagePool.erase(m_PagePool.begin() + PageId);
            //m_AvailablePages.erase(PageId);
        }
    }
    else
    {
        UNEXPECTED("Address not found in the allocations list - double freeing memory?");
    }
}